

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O1

S2CellUnion * __thiscall
S2CellUnion::Union(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellUnion *y)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  vector<S2CellId,_std::allocator<S2CellId>_> local_38;
  
  local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve
            (&local_38,
             (long)((int)((ulong)((long)(y->cell_ids_).
                                        super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(y->cell_ids_).
                                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 3) +
                   (int)((ulong)((long)(this->cell_ids_).
                                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->cell_ids_).
                                      super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3)));
  std::vector<S2CellId,_std::allocator<S2CellId>_>::operator=(&local_38,&this->cell_ids_);
  std::vector<S2CellId,std::allocator<S2CellId>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>>>
            ((vector<S2CellId,std::allocator<S2CellId>> *)&local_38,
             local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (y->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start,
             (y->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pSVar3 = local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pSVar2 = local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar1 = local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2CellUnion_002c1838
  ;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_start = pSVar1;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_finish = pSVar2;
  (__return_storage_ptr__->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pSVar3;
  Normalize(&__return_storage_ptr__->cell_ids_);
  if (local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Union(const S2CellUnion& y) const {
  vector<S2CellId> cell_ids;
  cell_ids.reserve(num_cells() + y.num_cells());
  cell_ids = cell_ids_;
  cell_ids.insert(cell_ids.end(), y.cell_ids_.begin(), y.cell_ids_.end());
  return S2CellUnion(std::move(cell_ids));
}